

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

qpTestResult
glu::TextureTestUtil::compareGenMipmapResult
          (TestLog *log,Texture2D *resultTexture,Texture2D *level0Reference,
          GenMipmapPrecision *precision)

{
  ostringstream *poVar1;
  bool bVar2;
  int iVar3;
  Vec4 *pVVar4;
  pointer pPVar5;
  undefined8 *puVar6;
  long *plVar7;
  Vec4 *pVVar8;
  GenMipmapPrecision *precision_00;
  size_type *psVar9;
  ConstPixelBufferAccess *access;
  Surface *surface;
  void *__buf;
  void *__buf_00;
  long lVar10;
  Vec4 *pVVar11;
  long lVar12;
  ulong uVar13;
  void *pvVar14;
  int iVar15;
  long lVar16;
  Surface errorMask;
  Vec4 threshold;
  ConstPixelBufferAccess dst;
  ConstPixelBufferAccess src;
  qpTestResult local_3b4;
  string local_3b0;
  undefined4 local_38c;
  Surface local_388;
  long *local_370;
  undefined8 local_368;
  long local_360;
  undefined8 uStack_358;
  Texture2D *local_350;
  LogImageSet local_348;
  ulong *local_300;
  long local_2f8;
  ulong local_2f0 [2];
  ulong *local_2e0;
  long local_2d8;
  ulong local_2d0 [2];
  GenMipmapPrecision *local_2c0;
  ulong *local_2b8;
  long local_2b0;
  ulong local_2a8 [2];
  string local_298;
  ulong *local_278;
  long local_270;
  ulong local_268 [2];
  string local_258;
  string local_238;
  long local_218;
  long local_210;
  ConstPixelBufferAccess local_208;
  ConstPixelBufferAccess local_1e0;
  undefined1 local_1b8 [16];
  TestLog local_1a8 [2];
  long *local_198;
  long local_188 [8];
  ios_base local_148 [8];
  ios_base local_140 [272];
  
  pVVar4 = (Vec4 *)local_1b8;
  local_1b8._0_8_ = (TestLog *)0x3f8000003f800000;
  local_1b8._8_8_ = 0x3f8000003f800000;
  pVVar8 = &precision->colorThreshold;
  local_348.m_name._M_dataplus._M_p = (pointer)0x0;
  local_348.m_name._M_string_length = 0;
  lVar10 = 0;
  do {
    pVVar11 = pVVar8;
    if ((precision->colorMask).m_data[lVar10] == false) {
      pVVar11 = pVVar4;
    }
    *(float *)((long)&local_348.m_name._M_dataplus._M_p + lVar10 * 4) = pVVar11->m_data[0];
    lVar10 = lVar10 + 1;
    pVVar4 = (Vec4 *)(pVVar4->m_data + 1);
    pVVar8 = (Vec4 *)(pVVar8->m_data + 1);
  } while (lVar10 != 4);
  local_350 = resultTexture;
  bVar2 = tcu::floatThresholdCompare
                    (log,"Level0","Level 0",
                     &((level0Reference->super_TextureLevelPyramid).m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                     &((resultTexture->super_TextureLevelPyramid).m_access.
                       super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess,
                     (Vec4 *)&local_348,COMPARE_LOG_RESULT);
  if (!bVar2) {
    poVar1 = (ostringstream *)(local_1b8 + 8);
    local_1b8._0_8_ = log;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"ERROR: Level 0 comparison failed!",0x21);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base(local_140);
  }
  local_3b4 = (qpTestResult)!bVar2;
  pPVar5 = (local_350->super_TextureLevelPyramid).m_access.
           super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (1 < (int)((ulong)((long)(local_350->super_TextureLevelPyramid).m_access.
                              super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5) >> 3) *
          -0x33333333) {
    lVar10 = 1;
    local_210 = 0x30;
    local_218 = 0x3c;
    lVar16 = 0;
    local_2c0 = precision;
    do {
      local_1e0.m_format = *(TextureFormat *)(pPVar5 + lVar10 + -1);
      lVar12 = 2;
      do {
        local_1e0.m_size.m_data[lVar12 + -2] =
             *(int *)((long)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar12 * 4 + lVar16 + -8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 5);
      lVar12 = 5;
      do {
        local_1e0.m_size.m_data[lVar12 + -2] =
             *(int *)((long)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar12 * 4 + lVar16 + -8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 8);
      local_1e0.m_data = pPVar5[lVar10 + -1].super_ConstPixelBufferAccess.m_data;
      local_208.m_format = *(TextureFormat *)(pPVar5 + lVar10);
      lVar12 = 0;
      do {
        local_208.m_size.m_data[lVar12] =
             *(int *)((long)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar12 * 4 + local_210 + -8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      lVar12 = 0;
      do {
        local_208.m_pitch.m_data[lVar12] =
             *(int *)((long)(pPVar5->super_ConstPixelBufferAccess).m_size.m_data +
                     lVar12 * 4 + local_218 + -8);
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      local_208.m_data = *(void **)((TextureFormat *)(pPVar5 + lVar10) + 4);
      tcu::Surface::Surface(&local_388,local_208.m_size.m_data[0],local_208.m_size.m_data[1]);
      local_348.m_name._M_dataplus._M_p = (pointer)0x300000008;
      pvVar14 = (void *)local_388.m_pixels.m_cap;
      if ((void *)local_388.m_pixels.m_cap != (void *)0x0) {
        pvVar14 = local_388.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_348,local_388.m_width,
                 local_388.m_height,1,pvVar14);
      iVar3 = compareGenMipmapBilinear
                        (&local_208,&local_1e0,(PixelBufferAccess *)local_1b8,local_2c0);
      local_38c = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar3 >> 8),1);
      iVar15 = (int)lVar10;
      if (iVar3 != 0) {
        poVar1 = (ostringstream *)(local_1b8 + 8);
        local_1b8._0_8_ = log;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"WARNING: Level ",0xf);
        std::ostream::operator<<(poVar1,iVar15);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," comparison to bilinear method failed, found ",0x2d);
        std::ostream::operator<<(poVar1,iVar3);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1," invalid pixels.",0x10);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base(local_140);
        local_348.m_name._M_dataplus._M_p = (pointer)0x300000008;
        pvVar14 = (void *)local_388.m_pixels.m_cap;
        if ((void *)local_388.m_pixels.m_cap != (void *)0x0) {
          pvVar14 = local_388.m_pixels.m_ptr;
        }
        tcu::PixelBufferAccess::PixelBufferAccess
                  ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_348,local_388.m_width,
                   local_388.m_height,1,pvVar14);
        iVar3 = compareGenMipmapBox(&local_208,&local_1e0,(PixelBufferAccess *)local_1b8,local_2c0);
        if (iVar3 != 0) {
          poVar1 = (ostringstream *)(local_1b8 + 8);
          local_1b8._0_8_ = log;
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1,"WARNING: Level ",0xf);
          std::ostream::operator<<(poVar1,iVar15);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," comparison to box method failed, found ",0x28);
          std::ostream::operator<<(poVar1,iVar3);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)poVar1," invalid pixels.",0x10);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::ios_base::~ios_base(local_140);
          if (local_3b4 == QP_TEST_RESULT_PASS) {
            local_3b4 = QP_TEST_RESULT_QUALITY_WARNING;
          }
          local_348.m_name._M_dataplus._M_p = (pointer)0x300000008;
          pvVar14 = (void *)local_388.m_pixels.m_cap;
          if ((void *)local_388.m_pixels.m_cap != (void *)0x0) {
            pvVar14 = local_388.m_pixels.m_ptr;
          }
          precision_00 = (GenMipmapPrecision *)(ulong)(uint)local_388.m_height;
          tcu::PixelBufferAccess::PixelBufferAccess
                    ((PixelBufferAccess *)local_1b8,(TextureFormat *)&local_348,local_388.m_width,
                     local_388.m_height,1,pvVar14);
          iVar3 = compareGenMipmapVeryLenient
                            (&local_208,&local_1e0,(PixelBufferAccess *)local_1b8,precision_00);
          if (iVar3 != 0) {
            poVar1 = (ostringstream *)(local_1b8 + 8);
            local_1b8._0_8_ = log;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"ERROR: Level ",0xd);
            std::ostream::operator<<(poVar1,iVar15);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," appears to contain ",0x14);
            std::ostream::operator<<(poVar1,iVar3);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1," completely wrong pixels, failing case!",0x27);
            tcu::MessageBuilder::operator<<
                      ((MessageBuilder *)local_1b8,(EndMessageToken *)&tcu::TestLog::EndMessage);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base(local_140);
            local_3b4 = QP_TEST_RESULT_FAIL;
            local_38c = 0;
          }
        }
      }
      local_2e0 = local_2d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e0,"Level","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::operator<<((MessageBuilder *)local_1b8,iVar15);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      uVar13 = 0xf;
      if (local_2e0 != local_2d0) {
        uVar13 = local_2d0[0];
      }
      if (uVar13 < (ulong)(local_270 + local_2d8)) {
        uVar13 = 0xf;
        if (local_278 != local_268) {
          uVar13 = local_268[0];
        }
        if (uVar13 < (ulong)(local_270 + local_2d8)) goto LAB_00508821;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_278,0,(char *)0x0,(ulong)local_2e0);
      }
      else {
LAB_00508821:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_2e0,(ulong)local_278);
      }
      local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
      psVar9 = puVar6 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar6 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_3b0.field_2._M_allocated_capacity = *psVar9;
        local_3b0.field_2._8_4_ = *(undefined4 *)(puVar6 + 3);
        local_3b0.field_2._12_4_ = *(undefined4 *)((long)puVar6 + 0x1c);
      }
      else {
        local_3b0.field_2._M_allocated_capacity = *psVar9;
        local_3b0._M_dataplus._M_p = (pointer)*puVar6;
      }
      local_3b0._M_string_length = puVar6[1];
      *puVar6 = psVar9;
      puVar6[1] = 0;
      *(undefined1 *)psVar9 = 0;
      local_300 = local_2f0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_300,"Level ","");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
      std::ostream::operator<<((MessageBuilder *)local_1b8,iVar15);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
      std::ios_base::~ios_base(local_148);
      uVar13 = 0xf;
      if (local_300 != local_2f0) {
        uVar13 = local_2f0[0];
      }
      if (uVar13 < (ulong)(local_2b0 + local_2f8)) {
        uVar13 = 0xf;
        if (local_2b8 != local_2a8) {
          uVar13 = local_2a8[0];
        }
        if (uVar13 < (ulong)(local_2b0 + local_2f8)) goto LAB_0050895a;
        puVar6 = (undefined8 *)
                 std::__cxx11::string::replace((ulong)&local_2b8,0,(char *)0x0,(ulong)local_300);
      }
      else {
LAB_0050895a:
        puVar6 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_300,(ulong)local_2b8);
      }
      local_370 = &local_360;
      plVar7 = puVar6 + 2;
      if ((long *)*puVar6 == plVar7) {
        local_360 = *plVar7;
        uStack_358 = puVar6[3];
      }
      else {
        local_360 = *plVar7;
        local_370 = (long *)*puVar6;
      }
      local_368 = puVar6[1];
      *puVar6 = plVar7;
      puVar6[1] = 0;
      *(undefined1 *)plVar7 = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&local_370);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
      psVar9 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar9) {
        local_298.field_2._M_allocated_capacity = *psVar9;
        local_298.field_2._8_8_ = plVar7[3];
      }
      else {
        local_298.field_2._M_allocated_capacity = *psVar9;
        local_298._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_298._M_string_length = plVar7[1];
      *plVar7 = (long)psVar9;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      tcu::LogImageSet::LogImageSet(&local_348,&local_3b0,&local_298);
      tcu::TestLog::startImageSet
                (log,local_348.m_name._M_dataplus._M_p,local_348.m_description._M_dataplus._M_p);
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"Result","");
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"Result","");
      access = &local_208;
      tcu::LogImage::LogImage
                ((LogImage *)local_1b8,&local_258,&local_238,access,QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)local_1b8,(int)log,__buf,(size_t)access);
      if (local_198 != local_188) {
        operator_delete(local_198,local_188[0] + 1);
      }
      if ((TestLog *)local_1b8._0_8_ != local_1a8) {
        operator_delete((void *)local_1b8._0_8_,(ulong)((long)&(local_1a8[0].m_log)->flags + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348.m_description._M_dataplus._M_p != &local_348.m_description.field_2) {
        operator_delete(local_348.m_description._M_dataplus._M_p,
                        local_348.m_description.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
        operator_delete(local_348.m_name._M_dataplus._M_p,
                        local_348.m_name.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298._M_dataplus._M_p != &local_298.field_2) {
        operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
      }
      if (local_370 != &local_360) {
        operator_delete(local_370,local_360 + 1);
      }
      if (local_2b8 != local_2a8) {
        operator_delete(local_2b8,local_2a8[0] + 1);
      }
      if (local_300 != local_2f0) {
        operator_delete(local_300,local_2f0[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
        operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
      }
      if (local_278 != local_268) {
        operator_delete(local_278,local_268[0] + 1);
      }
      if (local_2e0 != local_2d0) {
        operator_delete(local_2e0,local_2d0[0] + 1);
      }
      if ((char)local_38c == '\0') {
        local_348.m_name._M_dataplus._M_p = (pointer)&local_348.m_name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"ErrorMask","");
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"Error mask","");
        surface = &local_388;
        tcu::LogImage::LogImage
                  ((LogImage *)local_1b8,&local_348.m_name,&local_3b0,surface,
                   QP_IMAGE_COMPRESSION_MODE_BEST);
        tcu::LogImage::write((LogImage *)local_1b8,(int)log,__buf_00,(size_t)surface);
        if (local_198 != local_188) {
          operator_delete(local_198,local_188[0] + 1);
        }
        if ((TestLog *)local_1b8._0_8_ != local_1a8) {
          operator_delete((void *)local_1b8._0_8_,(ulong)((long)&(local_1a8[0].m_log)->flags + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3b0._M_dataplus._M_p != &local_3b0.field_2) {
          operator_delete(local_3b0._M_dataplus._M_p,local_3b0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_348.m_name._M_dataplus._M_p != &local_348.m_name.field_2) {
          operator_delete(local_348.m_name._M_dataplus._M_p,
                          local_348.m_name.field_2._M_allocated_capacity + 1);
        }
      }
      tcu::TestLog::endImageSet(log);
      tcu::Surface::~Surface(&local_388);
      lVar10 = lVar10 + 1;
      pPVar5 = (local_350->super_TextureLevelPyramid).m_access.
               super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>.
               _M_impl.super__Vector_impl_data._M_start;
      lVar16 = lVar16 + 0x28;
      local_210 = local_210 + 0x28;
      local_218 = local_218 + 0x28;
    } while (lVar10 < (int)((ulong)((long)(local_350->super_TextureLevelPyramid).m_access.
                                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar5)
                           >> 3) * -0x33333333);
  }
  return local_3b4;
}

Assistant:

qpTestResult compareGenMipmapResult (tcu::TestLog& log, const tcu::Texture2D& resultTexture, const tcu::Texture2D& level0Reference, const GenMipmapPrecision& precision)
{
	qpTestResult result = QP_TEST_RESULT_PASS;

	// Special comparison for level 0.
	{
		const tcu::Vec4		threshold	= select(precision.colorThreshold, tcu::Vec4(1.0f), precision.colorMask);
		const bool			level0Ok	= tcu::floatThresholdCompare(log, "Level0", "Level 0", level0Reference.getLevel(0), resultTexture.getLevel(0), threshold, tcu::COMPARE_LOG_RESULT);

		if (!level0Ok)
		{
			log << tcu::TestLog::Message << "ERROR: Level 0 comparison failed!" << tcu::TestLog::EndMessage;
			result = QP_TEST_RESULT_FAIL;
		}
	}

	for (int levelNdx = 1; levelNdx < resultTexture.getNumLevels(); levelNdx++)
	{
		const tcu::ConstPixelBufferAccess	src			= resultTexture.getLevel(levelNdx-1);
		const tcu::ConstPixelBufferAccess	dst			= resultTexture.getLevel(levelNdx);
		tcu::Surface						errorMask	(dst.getWidth(), dst.getHeight());
		bool								levelOk		= false;

		// Try different comparisons in quality order.

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapBilinear(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << " comparison to bilinear method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
		}

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapBox(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "WARNING: Level " << levelNdx << " comparison to box method failed, found " << numFailed << " invalid pixels." << tcu::TestLog::EndMessage;
		}

		// At this point all high-quality methods have been used.
		if (!levelOk && result == QP_TEST_RESULT_PASS)
			result = QP_TEST_RESULT_QUALITY_WARNING;

		if (!levelOk)
		{
			const int numFailed = compareGenMipmapVeryLenient(dst, src, errorMask.getAccess(), precision);
			if (numFailed == 0)
				levelOk = true;
			else
				log << tcu::TestLog::Message << "ERROR: Level " << levelNdx << " appears to contain " << numFailed << " completely wrong pixels, failing case!" << tcu::TestLog::EndMessage;
		}

		if (!levelOk)
			result = QP_TEST_RESULT_FAIL;

		log << tcu::TestLog::ImageSet(string("Level") + de::toString(levelNdx), string("Level ") + de::toString(levelNdx) + " result")
			<< tcu::TestLog::Image("Result", "Result", dst);

		if (!levelOk)
			log << tcu::TestLog::Image("ErrorMask", "Error mask", errorMask);

		log << tcu::TestLog::EndImageSet;
	}

	return result;
}